

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall kj::Promise<bool>::wait(Promise<bool> *this,void *__stat_loc)

{
  bool bVar1;
  Own<kj::_::PromiseNode> *node;
  bool *pbVar2;
  Exception *pEVar3;
  undefined8 extraout_RAX;
  Exception *exception_1;
  Exception *exception;
  bool *value;
  undefined1 local_180 [8];
  ExceptionOr<bool> result;
  WaitScope *waitScope_local;
  Promise<bool> *this_local;
  
  result._352_8_ = __stat_loc;
  _::ExceptionOr<bool>::ExceptionOr((ExceptionOr<bool> *)local_180);
  node = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)this);
  _::waitImpl(node,(ExceptionOrValue *)local_180,(WaitScope *)result._352_8_);
  pbVar2 = _::readMaybe<bool>((Maybe<bool> *)
                              ((long)&result.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
  if (pbVar2 != (bool *)0x0) {
    pEVar3 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_180);
    if (pEVar3 != (Exception *)0x0) {
      pEVar3 = mv<kj::Exception>(pEVar3);
      throwRecoverableException(pEVar3,0);
    }
    pbVar2 = mv<bool>(pbVar2);
    pbVar2 = _::returnMaybeVoid<bool>(pbVar2);
    bVar1 = *pbVar2;
    _::ExceptionOr<bool>::~ExceptionOr((ExceptionOr<bool> *)local_180);
    return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar1) & 0xffffff01;
  }
  pEVar3 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_180);
  if (pEVar3 != (Exception *)0x0) {
    pEVar3 = mv<kj::Exception>(pEVar3);
    throwFatalException(pEVar3,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }